

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O2

void __thiscall helics::tcp::TcpComms::setFlag(TcpComms *this,string_view flag,bool val)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  
  __y._M_str = "reuse_address";
  __y._M_len = 0xd;
  bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)flag,__y);
  if (bVar1) {
    bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
    if (!bVar1) {
      return;
    }
    this->reuse_address = val;
  }
  else {
    __y_00._M_str = "encrypted";
    __y_00._M_len = 9;
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)flag,__y_00);
    if (!bVar1) {
      NetworkCommsInterface::setFlag(&this->super_NetworkCommsInterface,flag,val);
      return;
    }
    bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
    if (!bVar1) {
      return;
    }
    (this->super_NetworkCommsInterface).encrypted = val;
  }
  CommsInterface::propertyUnLock((CommsInterface *)this);
  return;
}

Assistant:

void TcpComms::setFlag(std::string_view flag, bool val)
{
    if (flag == "reuse_address") {
        if (propertyLock()) {
            reuse_address = val;
            propertyUnLock();
        }
    } else if (flag == "encrypted") {
        if (propertyLock()) {
            encrypted = val;
            propertyUnLock();
        }
    } else {
        NetworkCommsInterface::setFlag(flag, val);
    }
}